

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

void __thiscall DSDcc::Viterbi::initCodes(Viterbi *this)

{
  long in_RDI;
  int i;
  uchar dataBit;
  uint in_stack_0000000c;
  uchar symbol;
  uchar *in_stack_00000018;
  Viterbi *in_stack_00000020;
  undefined4 local_10;
  undefined1 local_9;
  
  for (local_10 = 0; local_10 < 1 << ((char)*(undefined4 *)(in_RDI + 8) - 1U & 0x1f);
      local_10 = local_10 + 1) {
    encodeToSymbols(in_stack_00000020,in_stack_00000018,(uchar *)this,in_stack_0000000c,i);
    *(undefined1 *)(*(long *)(in_RDI + 0x30) + (long)(local_10 << 1)) = local_9;
    encodeToSymbols(in_stack_00000020,in_stack_00000018,(uchar *)this,in_stack_0000000c,i);
    *(undefined1 *)(*(long *)(in_RDI + 0x30) + (long)(local_10 * 2 + 1)) = local_9;
  }
  return;
}

Assistant:

void Viterbi::initCodes()
{
	unsigned char symbol;
	unsigned char dataBit;

	for (int i = 0; i < (1<<(m_k-1)); i++)
	{
		dataBit = 0;
		encodeToSymbols(&symbol, &dataBit, 1, i<<1);
		m_branchCodes[2*i] = symbol;
        dataBit = 1;
        encodeToSymbols(&symbol, &dataBit, 1, i<<1);
        m_branchCodes[2*i+1] = symbol;
	}
}